

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<char> * __thiscall
cimg_library::CImg<char>::assign
          (CImg<char> *this,char *values,uint size_x,uint size_y,uint size_z,uint size_c)

{
  ulong __n;
  unsigned_long uVar1;
  char *pcVar2;
  char *new_data;
  unsigned_long curr_siz;
  unsigned_long siz;
  uint size_c_local;
  uint size_z_local;
  uint size_y_local;
  uint size_x_local;
  char *values_local;
  CImg<char> *this_local;
  
  __n = (ulong)size_x * (ulong)size_y * (ulong)size_z * (ulong)size_c;
  if ((values == (char *)0x0) || (__n == 0)) {
    this_local = assign(this);
  }
  else {
    uVar1 = size(this);
    if ((values == this->_data) && (__n == uVar1)) {
      this_local = assign(this,size_x,size_y,size_z,size_c);
    }
    else {
      this_local = this;
      if ((((this->_is_shared & 1U) == 0) && (this->_data <= values + __n)) &&
         (pcVar2 = this->_data, uVar1 = size(this), values < pcVar2 + uVar1)) {
        pcVar2 = (char *)operator_new__(__n);
        memcpy(pcVar2,values,__n);
        if (this->_data != (char *)0x0) {
          operator_delete__(this->_data);
        }
        this->_data = pcVar2;
        this->_width = size_x;
        this->_height = size_y;
        this->_depth = size_z;
        this->_spectrum = size_c;
      }
      else {
        assign(this,size_x,size_y,size_z,size_c);
        if ((this->_is_shared & 1U) == 0) {
          memcpy(this->_data,values,__n);
        }
        else {
          memmove(this->_data,values,__n);
        }
      }
    }
  }
  return this_local;
}

Assistant:

CImg<T>& assign(const T *const values, const unsigned int size_x, const unsigned int size_y=1,
                    const unsigned int size_z=1, const unsigned int size_c=1) {
      const unsigned long siz = (unsigned long)size_x*size_y*size_z*size_c;
      if (!values || !siz) return assign();
      const unsigned long curr_siz = size();
      if (values==_data && siz==curr_siz) return assign(size_x,size_y,size_z,size_c);
      if (_is_shared || values + siz<_data || values>=_data + size()) {
        assign(size_x,size_y,size_z,size_c);
        if (_is_shared) std::memmove(_data,values,siz*sizeof(T));
        else std::memcpy(_data,values,siz*sizeof(T));
      } else {
        T *new_data = 0;
        try { new_data = new T[siz]; } catch (...) {
          _width = _height = _depth = _spectrum = 0; _data = 0;
          throw CImgInstanceException(_cimg_instance
                                      "assign(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      cimg::strbuffersize(sizeof(T)*size_x*size_y*size_z*size_c),
                                      size_x,size_y,size_z,size_c);
        }
        std::memcpy(new_data,values,siz*sizeof(T));
        delete[] _data; _data = new_data; _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c;
      }
      return *this;
    }